

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void vera::setMouseVisibility(bool _visible)

{
  bool _visible_local;
  
  if (_visible) {
    glfwSetInputMode(window,0x33001,0x34001);
  }
  else {
    glfwSetInputMode(window,0x33001,0x34002);
  }
  return;
}

Assistant:

void    setMouseVisibility(bool _visible) {
    #if defined(DRIVER_GLFW)
    if (_visible)
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    else
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    
    #endif
}